

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxShape.h
# Opt level: O1

void __thiscall
cbtBoxShape::batchedUnitVectorGetSupportingVertexWithoutMargin
          (cbtBoxShape *this,cbtVector3 *vectors,cbtVector3 *supportVerticesOut,int numVectors)

{
  cbtScalar cVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  long lVar8;
  undefined1 auVar9 [16];
  
  if (0 < numVectors) {
    lVar8 = 0;
    auVar9 = ZEXT816(0) << 0x40;
    do {
      cVar1 = (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
              m_implicitShapeDimensions.m_floats[0];
      cVar2 = (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
              m_implicitShapeDimensions.m_floats[1];
      uVar4 = vcmpss_avx512f(auVar9,ZEXT416(*(uint *)((long)vectors->m_floats + lVar8)),2);
      bVar5 = (bool)((byte)uVar4 & 1);
      uVar4 = vcmpss_avx512f(auVar9,ZEXT416(*(uint *)((long)vectors->m_floats + lVar8 + 4)),2);
      bVar6 = (bool)((byte)uVar4 & 1);
      cVar3 = (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
              m_implicitShapeDimensions.m_floats[2];
      uVar4 = vcmpss_avx512f(auVar9,ZEXT416(*(uint *)((long)vectors->m_floats + lVar8 + 8)),2);
      bVar7 = (bool)((byte)uVar4 & 1);
      *(uint *)((long)supportVerticesOut->m_floats + lVar8) =
           (uint)bVar5 * (int)cVar1 + (uint)!bVar5 * (int)-cVar1;
      *(uint *)((long)supportVerticesOut->m_floats + lVar8 + 4) =
           (uint)bVar6 * (int)cVar2 + (uint)!bVar6 * (int)-cVar2;
      *(uint *)((long)supportVerticesOut->m_floats + lVar8 + 8) =
           (uint)bVar7 * (int)cVar3 + (uint)!bVar7 * (int)-cVar3;
      *(undefined4 *)((long)supportVerticesOut->m_floats + lVar8 + 0xc) = 0;
      lVar8 = lVar8 + 0x10;
    } while ((ulong)(uint)numVectors << 4 != lVar8);
  }
  return;
}

Assistant:

virtual void batchedUnitVectorGetSupportingVertexWithoutMargin(const cbtVector3* vectors, cbtVector3* supportVerticesOut, int numVectors) const
	{
		const cbtVector3& halfExtents = getHalfExtentsWithoutMargin();

		for (int i = 0; i < numVectors; i++)
		{
			const cbtVector3& vec = vectors[i];
			supportVerticesOut[i].setValue(cbtFsels(vec.x(), halfExtents.x(), -halfExtents.x()),
										   cbtFsels(vec.y(), halfExtents.y(), -halfExtents.y()),
										   cbtFsels(vec.z(), halfExtents.z(), -halfExtents.z()));
		}
	}